

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddCorrFilePars(CEExecOptions *this)

{
  string *in_stack_fffffffffffffe48;
  allocator *default_val;
  string *in_stack_fffffffffffffe50;
  allocator *paVar1;
  string *in_stack_fffffffffffffe58;
  allocator *paVar2;
  CLOptions *this_00;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [40];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"nutation",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"File containing nutation corrections",&local_61);
  this_00 = (CLOptions *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"",(allocator *)this_00);
  CLOptions::AddStringParam
            (this_00,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  paVar2 = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ttut1hist",paVar2);
  paVar1 = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d8,"File containing \'TT - UT1\' corrections (historical)",paVar1);
  default_val = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",default_val);
  CLOptions::AddStringParam(this_00,(string *)paVar2,(string *)paVar1,(string *)default_val);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"ttut1pred",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,"File containing \'TT - UT1\' corrections (predicted)",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"",&local_179);
  CLOptions::AddStringParam(this_00,(string *)paVar2,(string *)paVar1,(string *)default_val);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  return;
}

Assistant:

inline
void CEExecOptions::AddCorrFilePars(void)
{
    AddStringParam("nutation", "File containing nutation corrections",
                   "");
    AddStringParam("ttut1hist", "File containing 'TT - UT1' corrections (historical)",
                   "");
    AddStringParam("ttut1pred", "File containing 'TT - UT1' corrections (predicted)",
                   "");
}